

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colStrBuf.c
# Opt level: O0

void * Col_StringBufferReserve(Col_Word strbuf,size_t length)

{
  char cVar1;
  ulong uVar2;
  uint local_44;
  uint local_40;
  uint local_3c;
  char *data;
  size_t maxLength;
  Col_StringFormat format;
  size_t length_local;
  Col_Word strbuf_local;
  
  if (strbuf == 0) {
    local_3c = 0;
  }
  else {
    if ((strbuf & 0xf) == 0) {
      if ((*(byte *)strbuf & 2) == 0) {
        local_44 = 0xffffffff;
      }
      else {
        local_44 = *(byte *)strbuf & 0xfffffffe;
      }
      local_40 = local_44;
    }
    else {
      local_40 = immediateWordTypes[strbuf & 0x1f];
    }
    local_3c = local_40;
  }
  length_local = strbuf;
  if ((local_3c == 2) && ((*(ushort *)(strbuf + 2) & 0xc) == 0)) {
    length_local = *(size_t *)(strbuf + 0x10);
  }
  if (length == 0) {
    strbuf_local = 0;
  }
  else {
    cVar1 = *(char *)(length_local + 1);
    uVar2 = ((long)(int)((uint)*(ushort *)(length_local + 2) << 5) - 0x18U) /
            (ulong)((int)cVar1 & 7);
    if (uVar2 < length) {
      strbuf_local = 0;
    }
    else {
      if (uVar2 - *(long *)(length_local + 0x10) < length) {
        CommitBuffer(length_local);
      }
      strbuf_local = length_local + 0x18 + (ulong)((int)cVar1 & 7) * *(long *)(length_local + 0x10);
      *(size_t *)(length_local + 0x10) = length + *(long *)(length_local + 0x10);
    }
  }
  return (void *)strbuf_local;
}

Assistant:

void *
Col_StringBufferReserve(
    Col_Word strbuf,    /*!< String buffer to reserve into. */
    size_t length)      /*!< Number of characters to reserve. Must be <=
                             [Col_StringBufferCapacity(strbuf)](@ref Col_StringBufferCapacity).
                         */
{
    Col_StringFormat format;
    size_t maxLength;
    const char *data;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_STRBUF,strbuf} */
    TYPECHECK_STRBUF(strbuf) return NULL;

    WORD_UNWRAP(strbuf);

    if (length == 0) {
        /*
        * No-op.
        */

        return NULL;
    }

    format = (Col_StringFormat) WORD_STRBUF_FORMAT(strbuf);
    maxLength = STRBUF_MAX_LENGTH(WORD_STRBUF_SIZE(strbuf) * CELL_SIZE,
            format);
    if (length > maxLength) {
        /*
         * Not enough room.
         */

        return NULL;
    }

    ASSERT(WORD_STRBUF_LENGTH(strbuf) <= maxLength);
    if (length > maxLength - WORD_STRBUF_LENGTH(strbuf)) {
        /*
         * Not enough remaining space, commit buffer first.
         */

        /*!
         * @sideeffect
         * May commit buffer.
         */
        CommitBuffer(strbuf);
        ASSERT(WORD_STRBUF_LENGTH(strbuf) == 0);
    }

    /*
     * Reserve area by shifting current length.
     */

    ASSERT(WORD_STRBUF_LENGTH(strbuf) + length <= maxLength);
    data = WORD_STRBUF_BUFFER(strbuf)
            + CHAR_WIDTH(format) * WORD_STRBUF_LENGTH(strbuf);
    WORD_STRBUF_LENGTH(strbuf) += length;
    return (void *) data;
}